

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# logger.h
# Opt level: O0

void __thiscall
Logger::Logger(Logger *this,string *logDir,string *logModuleName,LogLevel logLevel,
              bool outputToTerminal)

{
  undefined4 in_ECX;
  string *in_RDX;
  string *in_RSI;
  long in_RDI;
  byte in_R8B;
  queue<LogMessage,_std::deque<LogMessage,_std::allocator<LogMessage>_>_> *in_stack_ffffffffffffff60
  ;
  
  std::__cxx11::string::string((string *)(in_RDI + 8));
  std::__cxx11::string::string((string *)(in_RDI + 0x28));
  std::__cxx11::string::string((string *)(in_RDI + 0x48));
  std::__cxx11::string::string((string *)(in_RDI + 0x68));
  std::__cxx11::string::string((string *)(in_RDI + 0x88));
  std::ofstream::ofstream((void *)(in_RDI + 0xa8),(char *)0x0,_S_out);
  std::mutex::mutex((mutex *)0x10fe78);
  std::mutex::mutex((mutex *)0x10fe89);
  std::queue<LogMessage,std::deque<LogMessage,std::allocator<LogMessage>>>::
  queue<std::deque<LogMessage,std::allocator<LogMessage>>,void>(in_stack_ffffffffffffff60);
  std::thread::thread((thread *)0x10feb7);
  std::thread::thread((thread *)0x10fecd);
  std::condition_variable::condition_variable((condition_variable *)(in_RDI + 0x358));
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map((map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
         *)0x10fef9);
  std::__cxx11::string::operator=((string *)(in_RDI + 8),in_RSI);
  std::__cxx11::string::operator=((string *)(in_RDI + 0x28),in_RDX);
  *(undefined4 *)(in_RDI + 4) = in_ECX;
  *(byte *)(in_RDI + 1) = in_R8B & 1;
  std::__cxx11::string::operator=((string *)(in_RDI + 0x88),"./logger.conf");
  return;
}

Assistant:

Logger(std::string logDir, std::string logModuleName, LogLevel logLevel, bool outputToTerminal) {
        this->logDir = logDir;
        this->logModuleName = logModuleName;
        this->logLevel = logLevel;
        this->outputToTerminal = outputToTerminal;
        logConfigFile = "./logger.conf";   // 日志配置文件名称
    }